

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

void * clDeviceMemAllocINTEL
                 (cl_context context,cl_device_id device,cl_mem_properties_intel *properties,
                 size_t size,cl_uint alignment,cl_int *errcode_ret)

{
  _Rb_tree_header *p_Var1;
  CPointerTracker *pCVar2;
  CLIntercept *this;
  byte bVar3;
  cl_platform_id p_Var4;
  mapped_type *pmVar5;
  void *usmPtr;
  _func_void_ptr_cl_context_cl_device_id_cl_mem_properties_intel_ptr_size_t_cl_uint_cl_int_ptr
  *p_Var6;
  time_point end;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  cl_mem_properties_intel *newProperties;
  time_point local_90;
  cl_device_id device_local;
  cl_int localErrorCode;
  __int_type local_78;
  string local_70;
  string deviceInfo;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return (void *)0x0;
  }
  device_local = device;
  p_Var4 = CLIntercept::getPlatform(g_pIntercept,context);
  p_Var7 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 == (_Base_ptr)0x0) {
LAB_00139d17:
    deviceInfo._M_dataplus._M_p = (pointer)0x0;
    pmVar5 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)&deviceInfo);
  }
  else {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      if (*(cl_platform_id *)(p_Var7 + 1) >= p_Var4) {
        p_Var8 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(cl_platform_id *)(p_Var7 + 1) < p_Var4];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 == p_Var1) || (p_Var4 < *(cl_platform_id *)(p_Var8 + 1)))
    goto LAB_00139d17;
    pmVar5 = (mapped_type *)&p_Var8[1]._M_parent;
  }
  if (pmVar5->clDeviceMemAllocINTEL ==
      (_func_void_ptr_cl_context_cl_device_id_cl_mem_properties_intel_ptr_size_t_cl_uint_cl_int_ptr
       *)0x0) {
    return (void *)0x0;
  }
  local_78 = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  newProperties = (cl_mem_properties_intel *)0x0;
  deviceInfo._M_dataplus._M_p = (pointer)&deviceInfo.field_2;
  deviceInfo._M_string_length = 0;
  deviceInfo.field_2._M_local_buf[0] = '\0';
  bVar3 = (this->m_Config).CallLogging;
  if ((bool)bVar3 == true) {
    CLIntercept::getDeviceInfoString(this,1,&device_local,&deviceInfo);
    bVar3 = (this->m_Config).CallLogging;
  }
  if ((bVar3 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clDeviceMemAllocINTEL",local_78,(cl_kernel)0x0,
               "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",context,
               deviceInfo._M_dataplus._M_p,properties,size,alignment);
  }
  if ((this->m_Config).RelaxAllocationLimits == true) {
    CLIntercept::usmAllocPropertiesOverride(this,properties,&newProperties);
  }
  localErrorCode = 0;
  if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
     ((this->m_Config).ErrorAssert == false)) {
    if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_00139e04:
      errcode_ret = &localErrorCode;
    }
  }
  else if (errcode_ret == (cl_int *)0x0) goto LAB_00139e04;
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_90.__d.__r = (duration)0;
  }
  else {
    local_90.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  p_Var6 = pmVar5->clDeviceMemAllocINTEL;
  if (newProperties == (cl_mem_properties_intel *)0x0) {
LAB_00139e83:
    usmPtr = (*p_Var6)(context,device_local,properties,size,alignment,errcode_ret);
  }
  else {
    usmPtr = (*p_Var6)(context,device_local,newProperties,size,alignment,errcode_ret);
    if (usmPtr == (void *)0x0) {
      p_Var6 = pmVar5->clDeviceMemAllocINTEL;
      goto LAB_00139e83;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_78 &&
        (local_78 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      CLIntercept::updateHostTimingStats(this,"clDeviceMemAllocINTEL",&local_70,local_90,end);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
  }
  if ((usmPtr != (void *)0x0) &&
     (((((this->m_Config).DumpBuffersBeforeEnqueue != false ||
        ((this->m_Config).DumpBuffersAfterEnqueue != false)) ||
       ((this->m_Config).InjectBuffers != false)) ||
      (((this->m_Config).InjectImages != false || ((this->m_Config).CaptureReplay == true)))))) {
    CLIntercept::addUSMAllocation(this,usmPtr,size);
  }
  if (newProperties != (cl_mem_properties_intel *)0x0) {
    operator_delete__(newProperties);
  }
  newProperties = (cl_mem_properties_intel *)0x0;
  if ((this->m_Config).ErrorLogging == false) {
    bVar3 = (this->m_Config).ErrorAssert;
    if ((((bool)bVar3 == false) && ((this->m_Config).NoErrors != true)) || (*errcode_ret == 0))
    goto LAB_00139fe5;
  }
  else {
    if (*errcode_ret == 0) goto LAB_00139fe5;
    CLIntercept::logError(this,"clDeviceMemAllocINTEL",*errcode_ret);
    bVar3 = (this->m_Config).ErrorAssert;
  }
  if ((bVar3 & 1) != 0) {
    raise(5);
  }
  if ((this->m_Config).NoErrors == true) {
    *errcode_ret = 0;
  }
LAB_00139fe5:
  if ((usmPtr != (void *)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    pCVar2 = &(this->m_ObjectTracker).m_Pointers;
    (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clDeviceMemAllocINTEL",*errcode_ret,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "returned %p",usmPtr);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    CLIntercept::chromeCallLoggingExit(this,"clDeviceMemAllocINTEL",&local_70,false,0,local_90,end);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)deviceInfo._M_dataplus._M_p != &deviceInfo.field_2) {
    operator_delete(deviceInfo._M_dataplus._M_p);
    return usmPtr;
  }
  return usmPtr;
}

Assistant:

CL_API_ENTRY void* CL_API_CALL clDeviceMemAllocINTEL(
    cl_context context,
    cl_device_id device,
    const cl_mem_properties_intel* properties,
    size_t size,
    cl_uint alignment,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(context);
        if( dispatchX.clDeviceMemAllocINTEL )
        {
            GET_ENQUEUE_COUNTER();

            cl_mem_properties_intel*    newProperties = NULL;
            void*   retVal = NULL;

            std::string deviceInfo;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getDeviceInfoString(
                    1,
                    &device,
                    deviceInfo );
            }
            // TODO: Make properties string.
            CALL_LOGGING_ENTER( "context = %p, device = %s, properties = %p, size = %zu, alignment = %u",
                context,
                deviceInfo.c_str(),
                properties,
                size,
                alignment );
            USM_ALLOC_OVERRIDE_INIT( properties, newProperties );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            if( ( retVal == NULL ) && newProperties )
            {
                retVal = dispatchX.clDeviceMemAllocINTEL(
                    context,
                    device,
                    newProperties,
                    size,
                    alignment,
                    errcode_ret );
            }
            if( retVal == NULL )
            {
                retVal = dispatchX.clDeviceMemAllocINTEL(
                    context,
                    device,
                    properties,
                    size,
                    alignment,
                    errcode_ret );
            }

            HOST_PERFORMANCE_TIMING_END();
            ADD_USM_ALLOCATION( retVal, size );
            USM_ALLOC_PROPERTIES_CLEANUP( newProperties );
            CHECK_ERROR( errcode_ret[0] );
            ADD_POINTER_ALLOCATION( retVal );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            return retVal;
        }
    }

    return NULL;
}